

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeDualfarkas4Row
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *direction,SPxId enterId)

{
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  int iVar4;
  int i;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  long lVar6;
  uint uVar7;
  SPxId spxid;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sign;
  int local_150;
  DataKey local_148;
  DataKey local_140;
  cpp_dec_float<100U,_int,_void> local_138;
  cpp_dec_float<100U,_int,_void> local_e8;
  DataKey local_90;
  undefined1 local_88 [16];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  int local_48;
  bool local_44;
  undefined8 local_40;
  
  uVar7 = 0x3ff00000;
  local_140 = enterId.super_DataKey;
  if ((direction->m_backend).fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&local_e8,0,(type *)0x0);
    iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&direction->m_backend,&local_e8);
    uVar7 = 0x3ff00000;
    if (0 < iVar4) {
      uVar7 = 0xbff00000;
    }
  }
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 0x10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems[6] = 0;
  local_e8.data._M_elems[7] = 0;
  local_e8.data._M_elems[8] = 0;
  local_e8.data._M_elems[9] = 0;
  local_e8.data._M_elems[10] = 0;
  local_e8.data._M_elems[0xb] = 0;
  local_e8.data._M_elems[0xc] = 0;
  local_e8.data._M_elems[0xd] = 0;
  local_e8.data._M_elems._56_5_ = 0;
  local_e8.data._M_elems[0xf]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_e8,(double)((ulong)uVar7 << 0x20));
  this_00 = &this->dualFarkas;
  (this->dualFarkas).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(this_00,(this->theFvec->thedelta).super_IdxSet.num + 1);
  pUVar5 = this->theFvec;
  if (0 < (pUVar5->thedelta).super_IdxSet.num) {
    lVar6 = 0;
    do {
      local_148 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).theBaseId.data[(pUVar5->thedelta).super_IdxSet.idx[lVar6]].super_DataKey;
      if (local_148.info < 0) {
        SPxRowId::SPxRowId((SPxRowId *)&local_90,(SPxId *)&local_148);
        i = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,&local_90);
        pnVar2 = (this->theFvec->thedelta).
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar4 = (this->theFvec->thedelta).super_IdxSet.idx[lVar6];
        local_88._0_8_ = *(DataKey *)(pnVar2 + iVar4);
        local_88._8_8_ = ((DataKey *)(pnVar2 + iVar4))[1];
        puVar1 = (uint *)((long)&pnVar2[iVar4].m_backend.data + 0x10);
        local_78 = *(uint (*) [2])puVar1;
        auStack_70 = *(uint (*) [2])(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar2[iVar4].m_backend.data + 0x20);
        local_68 = *(uint (*) [2])puVar1;
        auStack_60 = *(uint (*) [2])(puVar1 + 2);
        puVar1 = (uint *)((long)&pnVar2[iVar4].m_backend.data + 0x30);
        local_58 = *(uint (*) [2])puVar1;
        auStack_50 = *(uint (*) [2])(puVar1 + 2);
        local_48 = pnVar2[iVar4].m_backend.exp;
        local_44 = pnVar2[iVar4].m_backend.neg;
        local_40._0_4_ = pnVar2[iVar4].m_backend.fpclass;
        local_40._4_4_ = pnVar2[iVar4].m_backend.prec_elem;
        local_138.data._M_elems[0xf]._1_3_ = local_e8.data._M_elems[0xf]._1_3_;
        local_138.data._M_elems._56_5_ = local_e8.data._M_elems._56_5_;
        local_138.data._M_elems[0] = local_e8.data._M_elems[0];
        local_138.data._M_elems[1] = local_e8.data._M_elems[1];
        local_138.data._M_elems[2] = local_e8.data._M_elems[2];
        local_138.data._M_elems[3] = local_e8.data._M_elems[3];
        local_138.data._M_elems[4] = local_e8.data._M_elems[4];
        local_138.data._M_elems[5] = local_e8.data._M_elems[5];
        local_138.data._M_elems[6] = local_e8.data._M_elems[6];
        local_138.data._M_elems[7] = local_e8.data._M_elems[7];
        local_138.data._M_elems[8] = local_e8.data._M_elems[8];
        local_138.data._M_elems[9] = local_e8.data._M_elems[9];
        local_138.data._M_elems[10] = local_e8.data._M_elems[10];
        local_138.data._M_elems[0xb] = local_e8.data._M_elems[0xb];
        local_138.data._M_elems[0xc] = local_e8.data._M_elems[0xc];
        local_138.data._M_elems[0xd] = local_e8.data._M_elems[0xd];
        local_138.exp = local_e8.exp;
        local_138.neg = local_e8.neg;
        local_138.fpclass = local_e8.fpclass;
        local_138.prec_elem = local_e8.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_138,(cpp_dec_float<100U,_int,_void> *)local_88);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(this_00,i,
              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_138);
        pUVar5 = this->theFvec;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pUVar5->thedelta).super_IdxSet.num);
  }
  local_150 = enterId.super_DataKey.info;
  if (local_150 < 0) {
    SPxRowId::SPxRowId((SPxRowId *)local_88,(SPxId *)&local_140);
    iVar4 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)local_88);
    local_138.data._M_elems[0xf]._1_3_ = local_e8.data._M_elems[0xf]._1_3_;
    local_138.data._M_elems._56_5_ = local_e8.data._M_elems._56_5_;
    local_138.data._M_elems[0] = local_e8.data._M_elems[0];
    local_138.data._M_elems[1] = local_e8.data._M_elems[1];
    uVar3 = local_138.data._M_elems._0_8_;
    local_138.data._M_elems[2] = local_e8.data._M_elems[2];
    local_138.data._M_elems[3] = local_e8.data._M_elems[3];
    local_138.data._M_elems[0xc] = local_e8.data._M_elems[0xc];
    local_138.data._M_elems[0xd] = local_e8.data._M_elems[0xd];
    local_138.data._M_elems[8] = local_e8.data._M_elems[8];
    local_138.data._M_elems[9] = local_e8.data._M_elems[9];
    local_138.data._M_elems[10] = local_e8.data._M_elems[10];
    local_138.data._M_elems[0xb] = local_e8.data._M_elems[0xb];
    local_138.data._M_elems[4] = local_e8.data._M_elems[4];
    local_138.data._M_elems[5] = local_e8.data._M_elems[5];
    local_138.data._M_elems[6] = local_e8.data._M_elems[6];
    local_138.data._M_elems[7] = local_e8.data._M_elems[7];
    local_138.exp = local_e8.exp;
    local_138.neg = local_e8.neg;
    local_138.fpclass = local_e8.fpclass;
    local_138.prec_elem = local_e8.prec_elem;
    local_138.data._M_elems[0] = local_e8.data._M_elems[0];
    if (local_e8.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
      local_138.neg = (bool)(local_e8.neg ^ 1);
    }
    local_138.data._M_elems._0_8_ = uVar3;
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(this_00,iVar4,
          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_138);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}